

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofHasBits
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  long lVar2;
  allocator local_c9;
  Iterator __begin3;
  Formatter format;
  string local_80;
  string local_60;
  Iterator __end3;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  __begin3.descriptor = this->descriptor_;
  __begin3.idx = 0;
  __end3.idx = *(int *)(__begin3.descriptor + 0x6c);
  __end3.descriptor = __begin3.descriptor;
  while( true ) {
    bVar1 = operator!=(&__begin3,&__end3);
    if (!bVar1) break;
    lVar2 = (long)__begin3.idx * 0x28 + *(long *)(__begin3.descriptor + 0x30);
    std::__cxx11::string::string((string *)&local_80,"oneof_name",(allocator *)&local_60);
    Formatter::Set<std::__cxx11::string>
              (&format,&local_80,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar2 + 8));
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_80,"oneof_index",&local_c9);
    local_60._M_dataplus._M_p._0_4_ =
         (undefined4)((lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x30)) / 0x28);
    Formatter::Set<int>(&format,&local_80,(int *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_80,"cap_oneof_name",&local_c9);
    ToUpper(&local_60,*(string **)(lVar2 + 8));
    Formatter::Set<std::__cxx11::string>(&format,&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    Formatter::operator()<>
              (&format,
               "inline bool $classname$::has_$oneof_name$() const {\n  return $oneof_name$_case() != $cap_oneof_name$_NOT_SET;\n}\ninline void $classname$::clear_has_$oneof_name$() {\n  _oneof_case_[$oneof_index$] = $cap_oneof_name$_NOT_SET;\n}\n"
              );
    __begin3.idx = __begin3.idx + 1;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateOneofHasBits(io::Printer* printer) {
  Formatter format(printer, variables_);
  for (auto oneof : OneOfRange(descriptor_)) {
    format.Set("oneof_name", oneof->name());
    format.Set("oneof_index", oneof->index());
    format.Set("cap_oneof_name", ToUpper(oneof->name()));
    format(
        "inline bool $classname$::has_$oneof_name$() const {\n"
        "  return $oneof_name$_case() != $cap_oneof_name$_NOT_SET;\n"
        "}\n"
        "inline void $classname$::clear_has_$oneof_name$() {\n"
        "  _oneof_case_[$oneof_index$] = $cap_oneof_name$_NOT_SET;\n"
        "}\n");
  }
}